

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O3

void __thiscall
cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
          (PortableBinaryInputArchive *this,istream *stream,Options *options)

{
  undefined8 in_RAX;
  uint8_t streamLittleEndian;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  (this->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_003ebfc8;
  InputArchive<cereal::PortableBinaryInputArchive,_1U>::InputArchive
            (&this->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>,this);
  (this->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_003ebfc8;
  this->itsStream = stream;
  this->itsConvertEndianness = '\0';
  loadBinary<1ul>((((this->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
                  super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&local_21,1);
  this->itsConvertEndianness = options->itsInputEndianness == little ^ local_21;
  return;
}

Assistant:

PortableBinaryInputArchive(std::istream & stream, Options const & options = Options::Default()) :
        InputArchive<PortableBinaryInputArchive, AllowEmptyClassElision>(this),
        itsStream(stream),
        itsConvertEndianness( false )
      {
        uint8_t streamLittleEndian;
        this->operator()( streamLittleEndian );
        itsConvertEndianness = options.is_little_endian() ^ streamLittleEndian;
      }